

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yuv_sse2.c
# Opt level: O0

void RGB32PackedToPlanar_SSE2(uint32_t *argb,__m128i *rgb)

{
  uint uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  __m128i *in_RSI;
  long in_RDI;
  undefined1 in_XMM0_Be;
  undefined1 in_XMM0_Bf;
  undefined1 in_XMM0_Bg;
  undefined1 in_XMM0_Bh;
  undefined1 in_XMM0_Bi;
  undefined1 in_XMM0_Bj;
  undefined1 in_XMM0_Bk;
  undefined1 in_XMM0_Bl;
  undefined1 in_XMM0_Bm;
  undefined1 in_XMM0_Bn;
  undefined1 in_XMM0_Bo;
  undefined1 in_XMM0_Bp;
  __m128i a3;
  __m128i a2;
  __m128i a1;
  __m128i a0;
  __m128i zero;
  __m128i *in2;
  __m128i *in1;
  undefined1 local_d8;
  undefined1 uStack_d7;
  undefined1 uStack_d6;
  undefined1 uStack_d5;
  undefined1 uStack_d4;
  undefined1 uStack_d3;
  undefined1 uStack_d2;
  undefined1 uStack_d1;
  undefined1 local_b8;
  undefined1 uStack_b7;
  undefined1 uStack_b6;
  undefined1 uStack_b5;
  undefined1 uStack_b4;
  undefined1 uStack_b3;
  undefined1 uStack_b2;
  undefined1 uStack_b1;
  undefined1 local_a8;
  undefined1 uStack_a7;
  undefined1 uStack_a6;
  undefined1 uStack_a5;
  undefined1 uStack_a4;
  undefined1 uStack_a3;
  undefined1 uStack_a2;
  undefined1 uStack_a1;
  undefined1 local_98;
  undefined1 uStack_97;
  undefined1 uStack_96;
  undefined1 uStack_95;
  undefined1 uStack_94;
  undefined1 uStack_93;
  undefined1 uStack_92;
  undefined1 uStack_91;
  undefined1 uStack_70;
  undefined1 uStack_6f;
  undefined1 uStack_6e;
  undefined1 uStack_6d;
  undefined1 uStack_6c;
  undefined1 uStack_6b;
  undefined1 uStack_6a;
  undefined1 uStack_69;
  undefined1 uStack_50;
  undefined1 uStack_4f;
  undefined1 uStack_4e;
  undefined1 uStack_4d;
  undefined1 uStack_4c;
  undefined1 uStack_4b;
  undefined1 uStack_4a;
  undefined1 uStack_49;
  undefined1 uStack_40;
  undefined1 uStack_3f;
  undefined1 uStack_3e;
  undefined1 uStack_3d;
  undefined1 uStack_3c;
  undefined1 uStack_3b;
  undefined1 uStack_3a;
  undefined1 uStack_39;
  undefined1 uStack_30;
  undefined1 uStack_2f;
  undefined1 uStack_2e;
  undefined1 uStack_2d;
  undefined1 uStack_2c;
  undefined1 uStack_2b;
  undefined1 uStack_2a;
  undefined1 uStack_29;
  
  uVar1 = CONCAT13(in_XMM0_Bp,CONCAT12(in_XMM0_Bo,CONCAT11(in_XMM0_Bn,in_XMM0_Bm))) ^
          CONCAT13(in_XMM0_Bp,CONCAT12(in_XMM0_Bo,CONCAT11(in_XMM0_Bn,in_XMM0_Bm)));
  in2 = (__m128i *)
        ((ulong)(CONCAT13(in_XMM0_Bh,CONCAT12(in_XMM0_Bg,CONCAT11(in_XMM0_Bf,in_XMM0_Be))) ^
                CONCAT13(in_XMM0_Bh,CONCAT12(in_XMM0_Bg,CONCAT11(in_XMM0_Bf,in_XMM0_Be)))) << 0x20);
  in1 = (__m128i *)
        CONCAT17((char)(uVar1 >> 0x18),
                 CONCAT16((char)(uVar1 >> 0x10),
                          CONCAT15((char)(uVar1 >> 8),
                                   CONCAT14((char)uVar1,
                                            CONCAT13(in_XMM0_Bl,
                                                     CONCAT12(in_XMM0_Bk,
                                                              CONCAT11(in_XMM0_Bj,in_XMM0_Bi))) ^
                                            CONCAT13(in_XMM0_Bl,
                                                     CONCAT12(in_XMM0_Bk,
                                                              CONCAT11(in_XMM0_Bj,in_XMM0_Bi)))))));
  uVar2 = *(undefined8 *)(in_RDI + 0x10);
  uVar3 = *(undefined8 *)(in_RDI + 0x18);
  uVar4 = *(undefined8 *)(in_RDI + 0x20);
  uVar5 = *(undefined8 *)(in_RDI + 0x28);
  uVar6 = *(undefined8 *)(in_RDI + 0x30);
  uVar7 = *(undefined8 *)(in_RDI + 0x38);
  VP8L32bToPlanar_SSE2(in_RSI,in1,in2,*(__m128i **)(in_RDI + 8));
  local_98 = (undefined1)uVar2;
  uStack_97 = (undefined1)((ulong)uVar2 >> 8);
  uStack_96 = (undefined1)((ulong)uVar2 >> 0x10);
  uStack_95 = (undefined1)((ulong)uVar2 >> 0x18);
  uStack_94 = (undefined1)((ulong)uVar2 >> 0x20);
  uStack_93 = (undefined1)((ulong)uVar2 >> 0x28);
  uStack_92 = (undefined1)((ulong)uVar2 >> 0x30);
  uStack_91 = (undefined1)((ulong)uVar2 >> 0x38);
  local_a8 = SUB81(in2,0);
  uStack_a7 = (undefined1)((ulong)in2 >> 8);
  uStack_a6 = (undefined1)((ulong)in2 >> 0x10);
  uStack_a5 = (undefined1)((ulong)in2 >> 0x18);
  uStack_a4 = (undefined1)((ulong)in2 >> 0x20);
  uStack_a3 = (undefined1)((ulong)in2 >> 0x28);
  uStack_a2 = (undefined1)((ulong)in2 >> 0x30);
  uStack_a1 = (undefined1)((ulong)in2 >> 0x38);
  *(undefined1 *)*in_RSI = local_98;
  *(undefined1 *)((long)*in_RSI + 1) = local_a8;
  *(undefined1 *)((long)*in_RSI + 2) = uStack_97;
  *(undefined1 *)((long)*in_RSI + 3) = uStack_a7;
  *(undefined1 *)((long)*in_RSI + 4) = uStack_96;
  *(undefined1 *)((long)*in_RSI + 5) = uStack_a6;
  *(undefined1 *)((long)*in_RSI + 6) = uStack_95;
  *(undefined1 *)((long)*in_RSI + 7) = uStack_a5;
  *(undefined1 *)(*in_RSI + 1) = uStack_94;
  *(undefined1 *)((long)*in_RSI + 9) = uStack_a4;
  *(undefined1 *)((long)*in_RSI + 10) = uStack_93;
  *(undefined1 *)((long)*in_RSI + 0xb) = uStack_a3;
  *(undefined1 *)((long)*in_RSI + 0xc) = uStack_92;
  *(undefined1 *)((long)*in_RSI + 0xd) = uStack_a2;
  *(undefined1 *)((long)*in_RSI + 0xe) = uStack_91;
  *(undefined1 *)((long)*in_RSI + 0xf) = uStack_a1;
  uStack_30 = (undefined1)uVar3;
  uStack_2f = (undefined1)((ulong)uVar3 >> 8);
  uStack_2e = (undefined1)((ulong)uVar3 >> 0x10);
  uStack_2d = (undefined1)((ulong)uVar3 >> 0x18);
  uStack_2c = (undefined1)((ulong)uVar3 >> 0x20);
  uStack_2b = (undefined1)((ulong)uVar3 >> 0x28);
  uStack_2a = (undefined1)((ulong)uVar3 >> 0x30);
  uStack_29 = (undefined1)((ulong)uVar3 >> 0x38);
  uStack_40 = SUB81(in1,0);
  uStack_3f = (undefined1)((ulong)in1 >> 8);
  uStack_3e = (undefined1)((ulong)in1 >> 0x10);
  uStack_3d = (undefined1)((ulong)in1 >> 0x18);
  uStack_3c = (undefined1)((ulong)in1 >> 0x20);
  uStack_3b = (undefined1)((ulong)in1 >> 0x28);
  uStack_3a = (undefined1)((ulong)in1 >> 0x30);
  uStack_39 = (undefined1)((ulong)in1 >> 0x38);
  *(undefined1 *)in_RSI[1] = uStack_30;
  *(undefined1 *)((long)in_RSI[1] + 1) = uStack_40;
  *(undefined1 *)((long)in_RSI[1] + 2) = uStack_2f;
  *(undefined1 *)((long)in_RSI[1] + 3) = uStack_3f;
  *(undefined1 *)((long)in_RSI[1] + 4) = uStack_2e;
  *(undefined1 *)((long)in_RSI[1] + 5) = uStack_3e;
  *(undefined1 *)((long)in_RSI[1] + 6) = uStack_2d;
  *(undefined1 *)((long)in_RSI[1] + 7) = uStack_3d;
  *(undefined1 *)(in_RSI[1] + 1) = uStack_2c;
  *(undefined1 *)((long)in_RSI[1] + 9) = uStack_3c;
  *(undefined1 *)((long)in_RSI[1] + 10) = uStack_2b;
  *(undefined1 *)((long)in_RSI[1] + 0xb) = uStack_3b;
  *(undefined1 *)((long)in_RSI[1] + 0xc) = uStack_2a;
  *(undefined1 *)((long)in_RSI[1] + 0xd) = uStack_3a;
  *(undefined1 *)((long)in_RSI[1] + 0xe) = uStack_29;
  *(undefined1 *)((long)in_RSI[1] + 0xf) = uStack_39;
  local_b8 = (undefined1)uVar4;
  uStack_b7 = (undefined1)((ulong)uVar4 >> 8);
  uStack_b6 = (undefined1)((ulong)uVar4 >> 0x10);
  uStack_b5 = (undefined1)((ulong)uVar4 >> 0x18);
  uStack_b4 = (undefined1)((ulong)uVar4 >> 0x20);
  uStack_b3 = (undefined1)((ulong)uVar4 >> 0x28);
  uStack_b2 = (undefined1)((ulong)uVar4 >> 0x30);
  uStack_b1 = (undefined1)((ulong)uVar4 >> 0x38);
  *(undefined1 *)in_RSI[2] = local_b8;
  *(undefined1 *)((long)in_RSI[2] + 1) = local_a8;
  *(undefined1 *)((long)in_RSI[2] + 2) = uStack_b7;
  *(undefined1 *)((long)in_RSI[2] + 3) = uStack_a7;
  *(undefined1 *)((long)in_RSI[2] + 4) = uStack_b6;
  *(undefined1 *)((long)in_RSI[2] + 5) = uStack_a6;
  *(undefined1 *)((long)in_RSI[2] + 6) = uStack_b5;
  *(undefined1 *)((long)in_RSI[2] + 7) = uStack_a5;
  *(undefined1 *)(in_RSI[2] + 1) = uStack_b4;
  *(undefined1 *)((long)in_RSI[2] + 9) = uStack_a4;
  *(undefined1 *)((long)in_RSI[2] + 10) = uStack_b3;
  *(undefined1 *)((long)in_RSI[2] + 0xb) = uStack_a3;
  *(undefined1 *)((long)in_RSI[2] + 0xc) = uStack_b2;
  *(undefined1 *)((long)in_RSI[2] + 0xd) = uStack_a2;
  *(undefined1 *)((long)in_RSI[2] + 0xe) = uStack_b1;
  *(undefined1 *)((long)in_RSI[2] + 0xf) = uStack_a1;
  uStack_50 = (undefined1)uVar5;
  uStack_4f = (undefined1)((ulong)uVar5 >> 8);
  uStack_4e = (undefined1)((ulong)uVar5 >> 0x10);
  uStack_4d = (undefined1)((ulong)uVar5 >> 0x18);
  uStack_4c = (undefined1)((ulong)uVar5 >> 0x20);
  uStack_4b = (undefined1)((ulong)uVar5 >> 0x28);
  uStack_4a = (undefined1)((ulong)uVar5 >> 0x30);
  uStack_49 = (undefined1)((ulong)uVar5 >> 0x38);
  *(undefined1 *)in_RSI[3] = uStack_50;
  *(undefined1 *)((long)in_RSI[3] + 1) = uStack_40;
  *(undefined1 *)((long)in_RSI[3] + 2) = uStack_4f;
  *(undefined1 *)((long)in_RSI[3] + 3) = uStack_3f;
  *(undefined1 *)((long)in_RSI[3] + 4) = uStack_4e;
  *(undefined1 *)((long)in_RSI[3] + 5) = uStack_3e;
  *(undefined1 *)((long)in_RSI[3] + 6) = uStack_4d;
  *(undefined1 *)((long)in_RSI[3] + 7) = uStack_3d;
  *(undefined1 *)(in_RSI[3] + 1) = uStack_4c;
  *(undefined1 *)((long)in_RSI[3] + 9) = uStack_3c;
  *(undefined1 *)((long)in_RSI[3] + 10) = uStack_4b;
  *(undefined1 *)((long)in_RSI[3] + 0xb) = uStack_3b;
  *(undefined1 *)((long)in_RSI[3] + 0xc) = uStack_4a;
  *(undefined1 *)((long)in_RSI[3] + 0xd) = uStack_3a;
  *(undefined1 *)((long)in_RSI[3] + 0xe) = uStack_49;
  *(undefined1 *)((long)in_RSI[3] + 0xf) = uStack_39;
  local_d8 = (undefined1)uVar6;
  uStack_d7 = (undefined1)((ulong)uVar6 >> 8);
  uStack_d6 = (undefined1)((ulong)uVar6 >> 0x10);
  uStack_d5 = (undefined1)((ulong)uVar6 >> 0x18);
  uStack_d4 = (undefined1)((ulong)uVar6 >> 0x20);
  uStack_d3 = (undefined1)((ulong)uVar6 >> 0x28);
  uStack_d2 = (undefined1)((ulong)uVar6 >> 0x30);
  uStack_d1 = (undefined1)((ulong)uVar6 >> 0x38);
  *(undefined1 *)in_RSI[4] = local_d8;
  *(undefined1 *)((long)in_RSI[4] + 1) = local_a8;
  *(undefined1 *)((long)in_RSI[4] + 2) = uStack_d7;
  *(undefined1 *)((long)in_RSI[4] + 3) = uStack_a7;
  *(undefined1 *)((long)in_RSI[4] + 4) = uStack_d6;
  *(undefined1 *)((long)in_RSI[4] + 5) = uStack_a6;
  *(undefined1 *)((long)in_RSI[4] + 6) = uStack_d5;
  *(undefined1 *)((long)in_RSI[4] + 7) = uStack_a5;
  *(undefined1 *)(in_RSI[4] + 1) = uStack_d4;
  *(undefined1 *)((long)in_RSI[4] + 9) = uStack_a4;
  *(undefined1 *)((long)in_RSI[4] + 10) = uStack_d3;
  *(undefined1 *)((long)in_RSI[4] + 0xb) = uStack_a3;
  *(undefined1 *)((long)in_RSI[4] + 0xc) = uStack_d2;
  *(undefined1 *)((long)in_RSI[4] + 0xd) = uStack_a2;
  *(undefined1 *)((long)in_RSI[4] + 0xe) = uStack_d1;
  *(undefined1 *)((long)in_RSI[4] + 0xf) = uStack_a1;
  uStack_70 = (undefined1)uVar7;
  uStack_6f = (undefined1)((ulong)uVar7 >> 8);
  uStack_6e = (undefined1)((ulong)uVar7 >> 0x10);
  uStack_6d = (undefined1)((ulong)uVar7 >> 0x18);
  uStack_6c = (undefined1)((ulong)uVar7 >> 0x20);
  uStack_6b = (undefined1)((ulong)uVar7 >> 0x28);
  uStack_6a = (undefined1)((ulong)uVar7 >> 0x30);
  uStack_69 = (undefined1)((ulong)uVar7 >> 0x38);
  *(undefined1 *)in_RSI[5] = uStack_70;
  *(undefined1 *)((long)in_RSI[5] + 1) = uStack_40;
  *(undefined1 *)((long)in_RSI[5] + 2) = uStack_6f;
  *(undefined1 *)((long)in_RSI[5] + 3) = uStack_3f;
  *(undefined1 *)((long)in_RSI[5] + 4) = uStack_6e;
  *(undefined1 *)((long)in_RSI[5] + 5) = uStack_3e;
  *(undefined1 *)((long)in_RSI[5] + 6) = uStack_6d;
  *(undefined1 *)((long)in_RSI[5] + 7) = uStack_3d;
  *(undefined1 *)(in_RSI[5] + 1) = uStack_6c;
  *(undefined1 *)((long)in_RSI[5] + 9) = uStack_3c;
  *(undefined1 *)((long)in_RSI[5] + 10) = uStack_6b;
  *(undefined1 *)((long)in_RSI[5] + 0xb) = uStack_3b;
  *(undefined1 *)((long)in_RSI[5] + 0xc) = uStack_6a;
  *(undefined1 *)((long)in_RSI[5] + 0xd) = uStack_3a;
  *(undefined1 *)((long)in_RSI[5] + 0xe) = uStack_69;
  *(undefined1 *)((long)in_RSI[5] + 0xf) = uStack_39;
  return;
}

Assistant:

static WEBP_INLINE void RGB32PackedToPlanar_SSE2(const uint32_t* const argb,
                                                 __m128i* const rgb /*in[6]*/) {
  const __m128i zero = _mm_setzero_si128();
  __m128i a0 = LOAD_16(argb + 0);
  __m128i a1 = LOAD_16(argb + 4);
  __m128i a2 = LOAD_16(argb + 8);
  __m128i a3 = LOAD_16(argb + 12);
  VP8L32bToPlanar_SSE2(&a0, &a1, &a2, &a3);
  rgb[0] = _mm_unpacklo_epi8(a1, zero);
  rgb[1] = _mm_unpackhi_epi8(a1, zero);
  rgb[2] = _mm_unpacklo_epi8(a2, zero);
  rgb[3] = _mm_unpackhi_epi8(a2, zero);
  rgb[4] = _mm_unpacklo_epi8(a3, zero);
  rgb[5] = _mm_unpackhi_epi8(a3, zero);
}